

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall cmDependsC::TransformLine(cmDependsC *this,string *line)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_b0;
  char c;
  iterator __end1;
  iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range1;
  string arg;
  string newline;
  string local_40;
  _Self local_20;
  iterator tri;
  string *line_local;
  cmDependsC *this_local;
  
  tri._M_node = (_Base_ptr)line;
  bVar1 = cmsys::RegularExpression::find(&this->IncludeRegexTransform,line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_40,&this->IncludeRegexTransform,3);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->TransformRules,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    newline.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->TransformRules);
    bVar1 = std::operator==(&local_20,(_Self *)((long)&newline.field_2 + 8));
    if (!bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_
                ((string *)((long)&arg.field_2 + 8),&this->IncludeRegexTransform,1);
      cmsys::RegularExpression::match_abi_cxx11_((string *)&__range1,&this->IncludeRegexTransform,4)
      ;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_20);
      __end1._M_current = (char *)std::__cxx11::string::begin();
      _Stack_b0._M_current = (char *)std::__cxx11::string::end();
      while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff50), bVar1) {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1);
        if (*pcVar2 == '%') {
          std::__cxx11::string::operator+=
                    ((string *)(arg.field_2._M_local_buf + 8),(string *)&__range1);
        }
        else {
          std::__cxx11::string::operator+=((string *)(arg.field_2._M_local_buf + 8),*pcVar2);
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1);
      }
      std::__cxx11::string::operator=
                ((string *)tri._M_node,(string *)(arg.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)(arg.field_2._M_local_buf + 8));
    }
  }
  return;
}

Assistant:

void cmDependsC::TransformLine(std::string& line)
{
  // Check for a transform rule match.  Return if none.
  if (!this->IncludeRegexTransform.find(line)) {
    return;
  }
  auto tri = this->TransformRules.find(this->IncludeRegexTransform.match(3));
  if (tri == this->TransformRules.end()) {
    return;
  }

  // Construct the transformed line.
  std::string newline = this->IncludeRegexTransform.match(1);
  std::string arg = this->IncludeRegexTransform.match(4);
  for (char c : tri->second) {
    if (c == '%') {
      newline += arg;
    } else {
      newline += c;
    }
  }

  // Return the transformed line.
  line = newline;
}